

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp_uint_t sexp_bignum_fxdiv(sexp ctx,sexp a,sexp_uint_t b,int offset)

{
  long lVar1;
  sexp_uint_t sVar2;
  long lVar3;
  int iVar4;
  
  sVar2 = sexp_bignum_hi(a);
  iVar4 = (int)sVar2;
  sVar2 = 0;
  while (iVar4 = iVar4 + -1, offset <= iVar4) {
    lVar1 = *(long *)((long)&a->value + (long)iVar4 * 8 + 0x10);
    lVar3 = __udivti3(lVar1,sVar2,b,0);
    *(long *)((long)&a->value + (long)iVar4 * 8 + 0x10) = lVar3;
    sVar2 = lVar1 - lVar3 * b;
  }
  return sVar2;
}

Assistant:

sexp_uint_t sexp_bignum_fxdiv (sexp ctx, sexp a, sexp_uint_t b, int offset) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), q, r=0;
  int i;
  sexp_luint_t n = luint_from_uint(0);
  for (i=len-1; i>=offset; i--) {
    n = luint_add(luint_shl(n,  sizeof(sexp_uint_t)*8), luint_from_uint(data[i]));
    q = luint_to_uint(luint_div_uint(n, b));
    r = luint_to_uint(luint_sub(n, luint_mul_uint(luint_from_uint(q),  b)));
    data[i] = q;
    n = luint_from_uint(r);
  }
  return r;
}